

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

uchar * base64_encode(uchar *str,int str_len)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uchar *puVar4;
  long lVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  
  iVar6 = str_len % 3;
  iVar3 = (str_len / 3) * 4 + 4;
  if (iVar6 == 0) {
    iVar3 = (str_len / 3) * 4;
  }
  lVar8 = (long)iVar3;
  puVar4 = (uchar *)malloc(lVar8 + 1);
  puVar4[lVar8] = '\0';
  pbVar7 = str + 2;
  for (lVar5 = 0; lVar5 < lVar8 + -2; lVar5 = lVar5 + 4) {
    bVar1 = pbVar7[-2];
    puVar4[lVar5] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
    bVar2 = pbVar7[-1];
    puVar4[lVar5 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
    bVar1 = *pbVar7;
    puVar4[lVar5 + 2] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(bVar1 >> 6) + (bVar2 & 0xf) * 4];
    puVar4[lVar5 + 3] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
    pbVar7 = pbVar7 + 3;
  }
  if (iVar6 != 2) {
    if (iVar6 != 1) {
      return puVar4;
    }
    puVar4[lVar5 + -2] = '=';
  }
  puVar4[lVar5 + -1] = '=';
  return puVar4;
}

Assistant:

unsigned char *base64_encode(unsigned char *str,int str_len) {
    long len;
    unsigned char *res;
    int i, j;
//定义base64编码表
    unsigned char *base64_table = (unsigned char *) "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

//计算经过base64编码后的字符串长度
    if (str_len % 3 == 0)
        len = str_len / 3 * 4;
    else
        len = (str_len / 3 + 1) * 4;

    res = static_cast<unsigned char *>(malloc(sizeof(unsigned char) * len + 1));
    res[len] = '\0';

//以3个8位字符为一组进行编码
    for (i = 0, j = 0; i < len - 2; j += 3, i += 4) {
        res[i] = base64_table[str[j] >> 2]; //取出第一个字符的前6位并找出对应的结果字符
        res[i + 1] = base64_table[(str[j] & 0x3) << 4 | (str[j + 1] >> 4)]; //将第一个字符的后位与第二个字符的前4位进行组合并找到对应的结果字符
        res[i + 2] = base64_table[(str[j + 1] & 0xf) << 2 | (str[j + 2] >> 6)]; //将第二个字符的后4位与第三个字符的前2位组合并找出对应的结果字符
        res[i + 3] = base64_table[str[j + 2] & 0x3f]; //取出第三个字符的后6位并找出结果字符
    }

    switch (str_len % 3) {
        case 1:
            res[i - 2] = '=';
            res[i - 1] = '=';
            break;
        case 2:
            res[i - 1] = '=';
            break;
    }

    return res;
}